

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::
blockCheck(StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_> *this)

{
  Endpoint **__dest;
  Endpoint **ppEVar1;
  Endpoint *pEVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (0x1f < this->bsize) {
    iVar4 = this->dataSlotsAvailable;
    lVar5 = (long)iVar4;
    if (lVar5 == 0) {
      ppEVar1 = (Endpoint **)operator_new__(0x200);
      this->dataptr = ppEVar1;
      this->dataSlotsAvailable = 0x40;
      this->dataSlotIndex = -1;
    }
    else if (iVar4 + -1 <= this->dataSlotIndex) {
      uVar3 = 0xffffffffffffffff;
      if (-1 < iVar4) {
        uVar3 = lVar5 << 4;
      }
      __dest = (Endpoint **)operator_new__(uVar3);
      ppEVar1 = this->dataptr;
      memmove(__dest,ppEVar1,lVar5 << 3);
      if (ppEVar1 != (Endpoint **)0x0) {
        operator_delete__(ppEVar1);
        iVar4 = this->dataSlotsAvailable;
      }
      this->dataptr = __dest;
      this->dataSlotsAvailable = iVar4 * 2;
    }
    iVar4 = this->freeIndex;
    if ((long)iVar4 == 0) {
      pEVar2 = (Endpoint *)operator_new(0xf00);
    }
    else {
      this->freeIndex = iVar4 + -1;
      pEVar2 = this->freeblocks[(long)iVar4 + -1];
    }
    iVar4 = this->dataSlotIndex;
    this->dataSlotIndex = iVar4 + 1;
    this->dataptr[(long)iVar4 + 1] = pEVar2;
    this->bsize = 0;
  }
  return;
}

Assistant:

void blockCheck()
        {
            if (bsize >= static_cast<int>(blockSize)) {
                if (0 == dataSlotsAvailable) {
                    dataptr = new X*[64];
                    dataSlotsAvailable = 64;
                    dataSlotIndex = -1;
                } else if (dataSlotIndex >= dataSlotsAvailable - 1) {
                    auto mem =
                        new X*[static_cast<size_t>(dataSlotsAvailable) * 2];
                    std::copy(dataptr, dataptr + dataSlotsAvailable, mem);
                    delete[] dataptr;
                    dataptr = mem;
                    dataSlotsAvailable *= 2;
                }
                dataptr[++dataSlotIndex] = getNewBlock();
                bsize = 0;
            }
        }